

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

transformData *
deleteTransformation(transformData *xform,abrAtomListProc *delAtomProc,void *deletestuff)

{
  xformAtomRecords_t *pxVar1;
  biasFunction_t *pbVar2;
  biasFunction *__ptr;
  xformAtomRecords *__ptr_00;
  transformData *ptVar3;
  
  if (xform == (transformData *)0x0) {
    ptVar3 = (transformData *)0x0;
  }
  else {
    __ptr_00 = xform->recs;
    while (__ptr_00 != (xformAtomRecords *)0x0) {
      pxVar1 = __ptr_00->next;
      if (__ptr_00->a != (atom *)0x0) {
        (*delAtomProc)(__ptr_00->a,deletestuff);
        __ptr_00->a = (atom *)0x0;
      }
      __ptr_00->next = (xformAtomRecords_t *)0x0;
      free(__ptr_00);
      __ptr_00 = pxVar1;
    }
    xform->recs = (xformAtomRecords *)0x0;
    xform->lastrec = (xformAtomRecords *)0x0;
    if (xform->name != (char *)0x0) {
      free(xform->name);
      xform->name = (char *)0x0;
    }
    __ptr = xform->funcs;
    while (__ptr != (biasFunction *)0x0) {
      pbVar2 = __ptr->next;
      __ptr->next = (biasFunction_t *)0x0;
      free(__ptr);
      __ptr = pbVar2;
    }
    xform->funcs = (biasFunction *)0x0;
    ptVar3 = xform->next;
    xform->next = (transformdata_t *)0x0;
    free(xform);
  }
  return ptVar3;
}

Assistant:

transformData* deleteTransformation(transformData* xform,
            abrAtomListProc delAtomProc, void *deletestuff) {
   transformData* following = NULL;
   xformAtomRecords *p = NULL, *next = NULL;
   biasFunction *f = NULL, *nextf = NULL;

   if (xform) {
      for (p = xform->recs; p; p = next) {
         next = p->next;
         deleteXformAtomRecord(p, delAtomProc, deletestuff);
      }
      xform->recs = xform->lastrec = NULL;

      if (xform->name != NULL) {
         free(xform->name);
         xform->name = NULL;
      }

      for (f = xform->funcs; f; f = nextf) {
	 nextf = f->next;
	 f->next = NULL;
	 free(f);
      }
      xform->funcs = NULL;

      following = xform->next;
      xform->next = NULL;
      free(xform);
   }
   return following;
}